

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O3

void __thiscall
onmt::Tokenizer::tokenize
          (Tokenizer *this,string *text,
          vector<onmt::Token,_std::allocator<onmt::Token>_> *annotated_tokens,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *alphabets,bool training)

{
  pointer pTVar1;
  element_type *peVar2;
  bool bVar3;
  vector<onmt::Token,_std::allocator<onmt::Token>_> *__range2;
  Token *token;
  pointer this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_onmt::Casing>
  local_78;
  vector<onmt::Token,_std::allocator<onmt::Token>_> local_48;
  
  if (text->_M_string_length != 0) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::reserve
              (annotated_tokens,text->_M_string_length);
    if ((this->_options).mode - Space < 2) {
      tokenize_on_placeholders(this,text,annotated_tokens);
    }
    else {
      tokenize_text(this,text,annotated_tokens,alphabets);
    }
    if (((this->_options).case_markup != false) || ((this->_options).case_feature == true)) {
      this_00 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar1 = (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pTVar1) {
        do {
          bVar3 = Token::is_placeholder(this_00);
          if (!bVar3) {
            lowercase_token(&local_78,&this_00->surface,&(this->_options).lang);
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_78);
            this_00->casing = local_78.second;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
              operator_delete(local_78.first._M_dataplus._M_p,
                              local_78.first.field_2._M_allocated_capacity + 1);
            }
          }
          this_00 = this_00 + 1;
        } while (this_00 != pTVar1);
      }
    }
    peVar2 = (this->_subword_encoder).
             super___shared_ptr<const_onmt::SubwordEncoder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 != (element_type *)0x0) {
      (*peVar2->_vptr_SubwordEncoder[8])(&local_48,peVar2,annotated_tokens,(ulong)training);
      local_78.first.field_2._M_allocated_capacity =
           (size_type)
           (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_78.first._M_dataplus._M_p =
           (pointer)(annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      local_78.first._M_string_length =
           (size_type)
           (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      (annotated_tokens->super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<onmt::Token,_std::allocator<onmt::Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector
                ((vector<onmt::Token,_std::allocator<onmt::Token>_> *)&local_78);
      std::vector<onmt::Token,_std::allocator<onmt::Token>_>::~vector(&local_48);
    }
  }
  return;
}

Assistant:

void Tokenizer::tokenize(const std::string& text,
                           std::vector<Token>& annotated_tokens,
                           std::unordered_map<std::string, size_t>* alphabets,
                           bool training) const
  {
    if (text.empty())
      return;

    annotated_tokens.reserve(text.size());

    switch (_options.mode)
    {
    case Mode::None:
    case Mode::Space:
      tokenize_on_placeholders(text, annotated_tokens);
      break;
    default:
      tokenize_text(text, annotated_tokens, alphabets);
      break;
    }

    if (_options.case_markup || _options.case_feature)
    {
      for (auto& token : annotated_tokens)
      {
        if (!token.is_placeholder())
          std::tie(token.surface, token.casing) = lowercase_token(token.surface, _options.lang);
      }
    }

    if (_subword_encoder)
      annotated_tokens = _subword_encoder->encode_and_annotate(annotated_tokens, training);
  }